

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall xLearn::Trainer::Train(Trainer *this)

{
  pointer ppRVar1;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  _Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_48;
  _Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_28,
             (this->reader_list_).
             super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppRVar1 = (this->reader_list_).
            super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(this->reader_list_).
            super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppRVar1 == 0x10) {
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_48,ppRVar1 + 1)
    ;
  }
  train(this,(vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_28,
        (vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_48);
  std::_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~_Vector_base(&local_48);
  std::_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Trainer::Train() {
  // Get train Reader and test Reader
  std::vector<Reader*> tr_reader;
  tr_reader.push_back(reader_list_[0]);
  std::vector<Reader*> te_reader;
  if (reader_list_.size() == 2) {
    te_reader.push_back(reader_list_[1]);
  }
  this->train(tr_reader, te_reader);
}